

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  cmOutputConverter *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  TargetType targetType;
  char *__s;
  string *psVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  cmValue cVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  undefined3 in_register_00000089;
  uint c;
  string_view source;
  string_view source_00;
  string output;
  string launcher;
  string cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string shellCommand;
  string workingDir;
  string dir;
  size_type local_1e0;
  pointer local_1d8;
  string local_1c0;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  cmRulePlaceholderExpander *this_01;
  
  if (CONCAT31(in_register_00000089,echo_comment) != 0) {
    __s = cmCustomCommandGenerator::GetComment(ccg);
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suffix,__s,(allocator<char> *)&output);
      AppendEcho(this,commands,&suffix,EchoGenerate,(EchoProgress *)0x0);
      std::__cxx11::string::~string((string *)&suffix);
    }
  }
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&dir,(string *)psVar4);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&workingDir,ccg);
  if (workingDir._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&dir);
  }
  if (content != (ostream *)0x0) {
    std::operator<<(content,(string *)&dir);
  }
  iVar2 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    (this);
  this_01 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar2);
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  c = 0;
  do {
    uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar3 <= c) {
      CreateCDCommand(this,&commands1,&dir,relative);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (commands,&commands1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands1);
      if (this_01 != (cmRulePlaceholderExpander *)0x0) {
        (*(this_01->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
      }
      std::__cxx11::string::~string((string *)&workingDir);
      std::__cxx11::string::~string((string *)&dir);
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&cmd,ccg,c);
    if (cmd._M_string_length != 0) {
      bVar1 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar1) {
        suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
        suffix._M_string_length = 0;
        suffix.field_2._M_local_buf[0] = '\0';
        if (cmd._M_string_length < 5) {
LAB_003411d3:
          bVar1 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&launcher,(ulong)&cmd);
          cmsys::SystemTools::LowerCase(&output,&launcher);
          std::__cxx11::string::operator=((string *)&suffix,(string *)&output);
          std::__cxx11::string::~string((string *)&output);
          std::__cxx11::string::~string((string *)&launcher);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&suffix,".bat");
          if (!bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&suffix,".cmd");
            if (!bVar1) goto LAB_003411d3;
          }
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)&suffix);
      }
      else {
        bVar1 = false;
      }
      cmsys::SystemTools::ReplaceString(&cmd,"/./","/");
      cVar11 = (char)&cmd;
      lVar5 = std::__cxx11::string::find(cVar11,0x2f);
      if (workingDir._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir(&suffix,this_00,&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&suffix);
        std::__cxx11::string::~string((string *)&suffix);
      }
      lVar6 = std::__cxx11::string::find(cVar11,0x2f);
      if ((lVar5 != -1) && (lVar6 == -1)) {
        suffix._M_dataplus._M_p = (pointer)0x2;
        suffix._M_string_length = (long)"/../" + 2;
        output._M_dataplus._M_p = (pointer)cmd._M_string_length;
        output._M_string_length = (size_type)cmd._M_dataplus._M_p;
        cmStrCat<>(&launcher,(cmAlphaNum *)&suffix,(cmAlphaNum *)&output);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&launcher);
        std::__cxx11::string::~string((string *)&launcher);
      }
      launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
      launcher._M_string_length = 0;
      launcher.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suffix,"RULE_LAUNCH_CUSTOM",(allocator<char> *)&output);
      cVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)this,target,&suffix);
      std::__cxx11::string::~string((string *)&suffix);
      if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
        memset((RuleVariables *)&suffix,0,0x150);
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        suffix._M_dataplus._M_p = (psVar4->_M_dataplus)._M_p;
        targetType = cmGeneratorTarget::GetType(target);
        psVar4 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
        suffix._M_string_length = (size_type)(psVar4->_M_dataplus)._M_p;
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        pvVar8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
        if ((pvVar8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&output);
          if (workingDir._M_string_length == 0) {
            cmOutputConverter::MaybeRelativeToCurBinDir(&shellCommand,this_00,&output);
            std::__cxx11::string::operator=((string *)&output,(string *)&shellCommand);
            std::__cxx11::string::~string((string *)&shellCommand);
          }
          source._M_str = output._M_dataplus._M_p;
          source._M_len = output._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&shellCommand,this_00,source,SHELL);
          std::__cxx11::string::operator=((string *)&output,(string *)&shellCommand);
          std::__cxx11::string::~string((string *)&shellCommand);
        }
        std::__cxx11::string::_M_assign((string *)&launcher);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_01,this_00,&launcher,(RuleVariables *)&suffix);
        if (launcher._M_string_length != 0) {
          std::__cxx11::string::append((char *)&launcher);
        }
        std::__cxx11::string::~string((string *)&output);
      }
      MaybeConvertWatcomShellCommand(&shellCommand,this,&cmd);
      if (shellCommand._M_string_length == 0) {
        source_00._M_str = cmd._M_dataplus._M_p;
        source_00._M_len = cmd._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&suffix,this_00,source_00,SHELL);
        std::__cxx11::string::operator=((string *)&shellCommand,(string *)&suffix);
        std::__cxx11::string::~string((string *)&suffix);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&suffix,
                     &launcher,&shellCommand);
      std::__cxx11::string::operator=((string *)&cmd,(string *)&suffix);
      std::__cxx11::string::~string((string *)&suffix);
      cmCustomCommandGenerator::AppendArguments(ccg,c,&cmd);
      if (content != (ostream *)0x0) {
        std::operator<<(content,cmd._M_dataplus._M_p + launcher._M_string_length);
      }
      if (this->BorlandMakeCurlyHack == true) {
        uVar9 = std::__cxx11::string::find(cVar11,0x7b);
        if ((uVar9 != 0xffffffffffffffff) && (uVar9 < cmd._M_string_length - 1)) {
          uVar10 = std::__cxx11::string::find(cVar11,0x7d);
          if (uVar9 < uVar10) {
            std::__cxx11::string::substr((ulong)&local_1e0,(ulong)&cmd);
            suffix._M_dataplus._M_p = local_1d8;
            suffix._M_string_length = local_1e0;
            output._M_dataplus._M_p = (pointer)0x3;
            output._M_string_length = (size_type)anon_var_dwarf_10f2937;
            std::__cxx11::string::substr((ulong)&local_50,(ulong)&cmd);
            cmStrCat<std::__cxx11::string>
                      (&local_1c0,(cmAlphaNum *)&suffix,(cmAlphaNum *)&output,&local_50);
            std::__cxx11::string::operator=((string *)&cmd,(string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_1e0);
          }
        }
      }
      if (launcher._M_string_length == 0) {
        if (bVar1) {
          suffix._M_dataplus._M_p = (pointer)0x5;
          suffix._M_string_length = (size_type)anon_var_dwarf_10f2943;
          output._M_dataplus._M_p = (pointer)cmd._M_string_length;
          output._M_string_length = (size_type)cmd._M_dataplus._M_p;
          cmStrCat<>(&local_1c0,(cmAlphaNum *)&suffix,(cmAlphaNum *)&output);
        }
        else {
          bVar1 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((!bVar1) || (*cmd._M_dataplus._M_p != '\"')) goto LAB_003416d2;
          suffix._M_dataplus._M_p = (pointer)0xd;
          suffix._M_string_length = (size_type)anon_var_dwarf_10f294f;
          output._M_dataplus._M_p = (pointer)cmd._M_string_length;
          output._M_string_length = (size_type)cmd._M_dataplus._M_p;
          cmStrCat<>(&local_1c0,(cmAlphaNum *)&suffix,(cmAlphaNum *)&output);
        }
        std::__cxx11::string::operator=((string *)&cmd,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
LAB_003416d2:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands1,
                 &cmd);
      std::__cxx11::string::~string((string *)&shellCommand);
      std::__cxx11::string::~string((string *)&launcher);
    }
    std::__cxx11::string::~string((string *)&cmd);
    c = c + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      cmValue val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (cmNonempty(val)) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType =
          cmState::GetTargetTypeName(target->GetType()).c_str();
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeRelativeToCurBinDir(output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = *val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            cmd =
              cmStrCat(cmd.substr(0, lcurly), "{{}", cmd.substr(lcurly + 1));
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = cmStrCat("call ", cmd);
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = cmStrCat("echo >nul && ", cmd);
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  // push back the custom commands
  cm::append(commands, commands1);
}